

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_influence.h
# Opt level: O2

void __thiscall
xray_re::_influence<unsigned_int,_float>::set
          (_influence<unsigned_int,_float> *this,uint16_t bone0,uint16_t bone1,float weight0)

{
  const_reference value;
  undefined6 in_register_00000032;
  _bone_weight<unsigned_int,_float> *value_00;
  _bone_weight<unsigned_int,_float> bw0;
  _bone_weight<unsigned_int,_float> bw1;
  _bone_weight<unsigned_int,_float> local_20;
  _bone_weight<unsigned_int,_float> local_18;
  
  local_20.bone = (uint)CONCAT62(in_register_00000032,bone0);
  if (bone0 == bone1) {
    value_00 = &local_20;
    local_20.weight = 1.0;
  }
  else {
    local_20.weight = 1.0 - weight0;
    local_18.bone = (uint)bone1;
    value_00 = &local_20;
    value = &local_18;
    if (bone0 < bone1) {
      value_00 = &local_18;
      value = &local_20;
    }
    local_18.weight = weight0;
    _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::push_back
              (&this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>,value);
  }
  _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::push_back
            (&this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>,value_00);
  return;
}

Assistant:

void _influence<Tb, Tw>::set(uint16_t bone0, uint16_t bone1, float weight0)
{
#if 0
	assert(weight0 >= 0.f && weight0 <= 1.f);
	assert(bone0 < MAX_BONES && bone1 < MAX_BONES);
#endif
	if (bone0 == bone1) {
		push_back(_bone_weight<Tb, Tw>(bone0, Tw(1)));
	} else {
		_bone_weight<Tb, Tw> bw0(bone0, Tw(1.f - weight0));
		_bone_weight<Tb, Tw> bw1(bone1, Tw(weight0));
#if 0
		xr_assert(weight0 != 0);
		xr_assert(1.f != weight0);
		xr_assert(!equivalent<Tw>(weight0, 0));
		xr_assert(!equivalent<Tw>(1.f - weight0, 0));
#endif
		if (bw0 < bw1) {
			push_back(bw0);
			push_back(bw1);
		} else {
			push_back(bw1);
			push_back(bw0);
		}
	}
}